

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintExpressionContents::visitPop(PrintExpressionContents *this,Pop *curr)

{
  ostream *stream;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"pop ",4);
  PrintSExpression::printType
            (this->parent,
             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)40>).super_Expression.type.
                   id);
  Colors::outputColorCode(this->o,"\x1b[0m");
  return;
}

Assistant:

void visitPop(Pop* curr) {
    prepareColor(o) << "pop ";
    printType(curr->type);
    restoreNormalColor(o);
  }